

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O3

void resolveRelocationAndSmartSmc(aint immediateOffset,EType minType)

{
  Relocation::resolveRelocationAffected(immediateOffset,minType);
  if (immediateOffset != 0x7fffffff) {
    if ((((smartSmcIndex != 0 &&
           sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
           super__Vector_impl_data._M_start !=
           sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
           super__Vector_impl_data._M_finish) &&
         (smartSmcIndex <=
          (ulong)(((long)smartSmcLines.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)smartSmcLines.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555))) &&
        (smartSmcLines.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
         super__Vector_impl_data._M_start[smartSmcIndex - 1].colBegin == 0xffffffff)) &&
       (((smartSmcLines.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
          super__Vector_impl_data._M_start[smartSmcIndex - 1].filename ==
          sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].filename &&
         (smartSmcLines.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
          super__Vector_impl_data._M_start[smartSmcIndex - 1].line ==
          sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].line)) &&
        (sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].colBegin < 2)))) {
      smartSmcLines.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
      super__Vector_impl_data._M_start[smartSmcIndex - 1].colBegin = immediateOffset;
    }
  }
  return;
}

Assistant:

void resolveRelocationAndSmartSmc(const aint immediateOffset, Relocation::EType minType) {
	// call relocation data generator to do its own errands
	Relocation::resolveRelocationAffected(immediateOffset, minType);
	// check smart-SMC functionality, if there is unresolved record to be set up
	if (INT_MAX == immediateOffset || sourcePosStack.empty() || 0 == smartSmcIndex) return;
	if (smartSmcLines.size() < smartSmcIndex) return;
	auto & smartSmc = smartSmcLines.at(smartSmcIndex - 1);
	if (~0U != smartSmc.colBegin || smartSmc != sourcePosStack.back()) return;
	if (1 < sourcePosStack.back().colBegin) return;		// only first segment belongs to SMC label
	// record does match current line, resolve the smart offset
	smartSmc.colBegin = immediateOffset;
}